

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

_Bool mfb_wait_sync(mfb_window *window)

{
  int iVar1;
  long *in_RDI;
  double dVar2;
  XEvent *in_stack_00000008;
  uint32_t millis;
  double current;
  XEvent event;
  SWindowData_X11 *window_data_x11;
  SWindowData *window_data;
  mfb_timer *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar3;
  undefined1 local_e0 [192];
  long local_20;
  long *local_18;
  _Bool local_1;
  
  if (in_RDI == (long *)0x0) {
    local_1 = false;
  }
  else if ((*(byte *)((long)in_RDI + 0x2aa) & 1) == 0) {
    if (g_use_hardware_sync) {
      local_1 = true;
    }
    else {
      local_20 = *in_RDI;
      local_18 = in_RDI;
      XFlush(*(undefined8 *)(local_20 + 8));
      iVar3 = 1;
      do {
        do {
          dVar2 = mfb_timer_now(in_stack_ffffffffffffff08);
          if (g_time_for_frame * 0.96 <= dVar2) {
            mfb_timer_reset((mfb_timer *)0x1047ee);
            return true;
          }
          if (g_time_for_frame * 0.8 <= dVar2) {
            iVar3 = 0;
          }
          usleep(iVar3 * 1000);
        } while ((iVar3 != 1) || (iVar1 = XEventsQueued(*(undefined8 *)(local_20 + 8),0), iVar1 < 1)
                );
        XNextEvent(*(undefined8 *)(local_20 + 8),local_e0);
        processEvent((SWindowData *)current,in_stack_00000008);
      } while ((*(byte *)((long)local_18 + 0x2aa) & 1) == 0);
      destroy_window_data((SWindowData *)CONCAT44(iVar3,in_stack_ffffffffffffff10));
      local_1 = false;
    }
  }
  else {
    destroy_window_data((SWindowData *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)
                       );
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
mfb_wait_sync(struct mfb_window *window) {
    if (window == 0x0) {
        return false;
    }

    SWindowData *window_data = (SWindowData *) window;
    if (window_data->close) {
        destroy_window_data(window_data);
        return false;
    }

    if(g_use_hardware_sync) {
        return true;
    }

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
    XFlush(window_data_x11->display);
    XEvent      event;
    double      current;
    uint32_t    millis = 1;
    while(1) {
        current = mfb_timer_now(window_data_x11->timer);
        if (current >= g_time_for_frame * 0.96) {
            mfb_timer_reset(window_data_x11->timer);
            return true;
        }
        else if(current >= g_time_for_frame * 0.8) {
            millis = 0;
        }

        usleep(millis * 1000);
        //sched_yield();

        if(millis == 1 && XEventsQueued(window_data_x11->display, QueuedAlready) > 0) {
            XNextEvent(window_data_x11->display, &event);
            processEvent(window_data, &event);

            if(window_data->close) {
                destroy_window_data(window_data);
                return false;
            }
        }
    }

    return true;
}